

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

void __thiscall CDirectiveData::writeSymData(CDirectiveData *this,SymbolData *symData)

{
  DataType type;
  int64_t address;
  uint uVar1;
  size_t size;
  
  uVar1 = this->mode - U8;
  if (uVar1 < 9) {
    type = *(DataType *)(&DAT_00182298 + (ulong)uVar1 * 4);
    address = this->position;
    size = getDataSize(this);
    SymbolData::addData(symData,address,size,type);
    return;
  }
  return;
}

Assistant:

void CDirectiveData::writeSymData(SymbolData& symData) const
{
	switch (mode)
	{
	case EncodingMode::Ascii:
		symData.addData(position,getDataSize(),SymbolData::DataAscii);
		break;
	case EncodingMode::U8:
	case EncodingMode::Sjis:
	case EncodingMode::Custom:
		symData.addData(position,getDataSize(),SymbolData::Data8);
		break;
	case EncodingMode::U16:
		symData.addData(position,getDataSize(),SymbolData::Data16);
		break;
	case EncodingMode::U32:
	case EncodingMode::Float:
		symData.addData(position,getDataSize(),SymbolData::Data32);
		break;
	case EncodingMode::U64:
	case EncodingMode::Double:
		symData.addData(position,getDataSize(),SymbolData::Data64);
		break;
	case EncodingMode::Invalid:
		// TODO: Assert?
		break;
	}
}